

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

CURLcode Curl_cpool_add_conn(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  Curl_share *pCVar2;
  char *__src;
  Curl_llist_node *__n;
  hash_function p_Var3;
  Curl_llist *l;
  void *pvVar4;
  Curl_hash *h;
  CURLcode CVar5;
  
  if (data == (Curl_easy *)0x0) {
    h = (Curl_hash *)0x0;
  }
  else {
    pCVar2 = data->share;
    if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x20) == 0)) {
      if (data->multi_easy == (Curl_multi *)0x0) {
        h = &(data->multi->cpool).dest2bundle;
        if (data->multi == (Curl_multi *)0x0) {
          h = (Curl_hash *)0x0;
        }
      }
      else {
        h = &(data->multi_easy->cpool).dest2bundle;
      }
    }
    else {
      h = &(pCVar2->cpool).dest2bundle;
    }
  }
  if (h == (Curl_hash *)0x0) {
    return CURLE_FAILED_INIT;
  }
  if ((h[2].size != 0) && ((*(byte *)(h[2].size + 4) & 0x20) != 0)) {
    Curl_share_lock((Curl_easy *)h[2].dtor,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  *(byte *)&h[3].hash_func = *(byte *)&h[3].hash_func | 1;
  l = (Curl_llist *)Curl_hash_pick(h,conn->destination,conn->destination_len);
  if (l == (Curl_llist *)0x0) {
    __src = conn->destination;
    __n = (Curl_llist_node *)conn->destination_len;
    l = (Curl_llist *)(*Curl_ccalloc)(1,(size_t)&__n[1]._prev);
    if (l == (Curl_llist *)0x0) {
      l = (Curl_llist *)0x0;
    }
    else {
      Curl_llist_init(l,(Curl_llist_dtor)0x0);
      l[1]._head = __n;
      memcpy(&l[1]._tail,__src,(size_t)__n);
    }
    if (l == (Curl_llist *)0x0) {
LAB_00119f5f:
      l = (Curl_llist *)0x0;
    }
    else {
      pvVar4 = Curl_hash_add(h,&l[1]._tail,(size_t)l[1]._head,l);
      if (pvVar4 == (void *)0x0) {
        (*Curl_cfree)(l);
        goto LAB_00119f5f;
      }
    }
    if (l == (Curl_llist *)0x0) {
      CVar5 = CURLE_OUT_OF_MEMORY;
      goto LAB_00119f93;
    }
  }
  Curl_llist_append(l,conn,&conn->cpool_node);
  puVar1 = &(conn->bits).field_0x4;
  *puVar1 = *puVar1 | 2;
  p_Var3 = h[1].hash_func;
  h[1].hash_func = p_Var3 + 1;
  conn->connection_id = (curl_off_t)p_Var3;
  h[1].table = (Curl_llist *)((long)&(h[1].table)->_head + 1);
  CVar5 = CURLE_OK;
LAB_00119f93:
  *(byte *)&h[3].hash_func = *(byte *)&h[3].hash_func & 0xfe;
  if ((h[2].size != 0) && ((*(byte *)(h[2].size + 4) & 0x20) != 0)) {
    Curl_share_unlock((Curl_easy *)h[2].dtor,CURL_LOCK_DATA_CONNECT);
  }
  return CVar5;
}

Assistant:

CURLcode Curl_cpool_add_conn(struct Curl_easy *data,
                             struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct cpool_bundle *bundle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  DEBUGASSERT(conn);

  DEBUGASSERT(cpool);
  if(!cpool)
    return CURLE_FAILED_INIT;

  CPOOL_LOCK(cpool);
  bundle = cpool_find_bundle(cpool, conn);
  if(!bundle) {
    bundle = cpool_add_bundle(cpool, conn);
    if(!bundle) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  cpool_bundle_add(bundle, conn);
  conn->connection_id = cpool->next_connection_id++;
  cpool->num_conn++;
  DEBUGF(infof(data, "Added connection %" FMT_OFF_T ". "
               "The cache now contains %zu members",
               conn->connection_id, cpool->num_conn));
out:
  CPOOL_UNLOCK(cpool);

  return result;
}